

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O2

void __thiscall helics::apps::Recorder::writeTextFile(Recorder *this,string *filename)

{
  iterator *this_00;
  long lVar1;
  Time TVar2;
  ulong uVar3;
  Recorder *pRVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  reference pIVar8;
  string *psVar9;
  Message *pMVar10;
  string *psVar11;
  string *psVar12;
  pointer pVVar13;
  pointer puVar14;
  pointer pVVar15;
  double dVar16;
  string_view str2encode;
  allocator<char> local_291;
  pointer local_290;
  Recorder *local_288;
  string local_280;
  basic_string_view<char,_std::char_traits<char>_> local_260;
  string local_250;
  ofstream outFile;
  
  if (filename->_M_string_length == 0) {
    filename = &(this->super_App).outFileName;
  }
  std::ofstream::ofstream(&outFile,(string *)filename,_S_out);
  pVVar13 = (this->points).
            super__Vector_base<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pVVar15 = pVVar13;
  if (pVVar13 !=
      (this->points).
      super__Vector_base<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::operator<<((ostream *)&outFile,"#time \ttag\t type*\t value\n");
    pVVar15 = (this->points).
              super__Vector_base<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pVVar13 = (this->points).
              super__Vector_base<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  this_00 = &(this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
             _M_impl.super__Deque_impl_data._M_start;
  local_288 = this;
  while (pRVar4 = local_288, psVar12 = &pVVar15->value,
        (pointer)((long)(psVar12 + -1) + 0x10) != pVVar13) {
    if (*(char *)((long)(psVar12 + -1) + 0x1e) == '\x01') {
      lVar1 = *(long *)((long)(psVar12 + -1) + 0x10);
      poVar7 = std::ostream::_M_insert<double>
                         ((double)(lVar1 % 1000000000) * 1e-09 + (double)(lVar1 / 1000000000));
      poVar7 = std::operator<<(poVar7,"\t\t");
      pIVar8 = CLI::std::_Deque_iterator<helics::Input,_helics::Input_&,_helics::Input_*>::
               operator[](this_00,(long)*(int *)((long)(psVar12 + -1) + 0x18));
      psVar9 = Input::getTarget_abi_cxx11_(pIVar8);
      poVar7 = std::operator<<(poVar7,(string *)psVar9);
      poVar7 = std::operator<<(poVar7,'\t');
      pIVar8 = CLI::std::_Deque_iterator<helics::Input,_helics::Input_&,_helics::Input_*>::
               operator[](this_00,(long)*(int *)((long)(psVar12 + -1) + 0x18));
      psVar9 = Input::getPublicationType_abi_cxx11_(pIVar8);
      poVar7 = std::operator<<(poVar7,(string *)psVar9);
      poVar7 = std::operator<<(poVar7,'\t');
      generateJsonQuotedString(&local_280,psVar12);
      poVar7 = std::operator<<(poVar7,(string *)&local_280);
      std::operator<<(poVar7,'\n');
    }
    else {
      dVar16 = (double)(*(long *)((long)(psVar12 + -1) + 0x10) % 1000000000) * 1e-09 +
               (double)(*(long *)((long)(psVar12 + -1) + 0x10) / 1000000000);
      if (*(short *)((long)(psVar12 + -1) + 0x1c) < 1) {
        poVar7 = std::ostream::_M_insert<double>(dVar16);
        poVar7 = std::operator<<(poVar7,"\t\t");
        pIVar8 = CLI::std::_Deque_iterator<helics::Input,_helics::Input_&,_helics::Input_*>::
                 operator[](this_00,(long)*(int *)((long)(psVar12 + -1) + 0x18));
        psVar9 = Input::getTarget_abi_cxx11_(pIVar8);
        poVar7 = std::operator<<(poVar7,(string *)psVar9);
        poVar7 = std::operator<<(poVar7,'\t');
        generateJsonQuotedString(&local_280,psVar12);
        poVar7 = std::operator<<(poVar7,(string *)&local_280);
        std::operator<<(poVar7,'\n');
      }
      else {
        poVar7 = std::ostream::_M_insert<double>(dVar16);
        poVar7 = std::operator<<(poVar7,':');
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,*(short *)((long)(psVar12 + -1) + 0x1c))
        ;
        poVar7 = std::operator<<(poVar7,"\t\t");
        pIVar8 = CLI::std::_Deque_iterator<helics::Input,_helics::Input_&,_helics::Input_*>::
                 operator[](this_00,(long)*(int *)((long)(psVar12 + -1) + 0x18));
        psVar9 = Input::getTarget_abi_cxx11_(pIVar8);
        poVar7 = std::operator<<(poVar7,(string *)psVar9);
        poVar7 = std::operator<<(poVar7,'\t');
        generateJsonQuotedString(&local_280,psVar12);
        poVar7 = std::operator<<(poVar7,(string *)&local_280);
        std::operator<<(poVar7,'\n');
      }
    }
    std::__cxx11::string::~string((string *)&local_280);
    pVVar15 = (pointer)(psVar12 + 1);
  }
  puVar14 = (local_288->messages).
            super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_290 = puVar14;
  if (puVar14 !=
      (local_288->messages).
      super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::operator<<((ostream *)&outFile,"# m\t time \tsource\t dest\t message\n");
    puVar14 = (pRVar4->messages).
              super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_290 = (pRVar4->messages).
                super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  }
  do {
    if (puVar14 == local_290) {
      std::ofstream::~ofstream(&outFile);
      return;
    }
    std::operator<<((ostream *)&outFile,"m\t");
    TVar2.internalTimeCode =
         (((puVar14->_M_t).
           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
           super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->time).internalTimeCode;
    poVar7 = std::ostream::_M_insert<double>
                       ((double)(TVar2.internalTimeCode % 1000000000) * 1e-09 +
                        (double)(TVar2.internalTimeCode / 1000000000));
    poVar7 = std::operator<<(poVar7,'\t');
    poVar7 = std::operator<<(poVar7,(string *)
                                    &((puVar14->_M_t).
                                      super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                                      .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)
                                     ->source);
    std::operator<<(poVar7,'\t');
    pMVar10 = (puVar14->_M_t).
              super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
              super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
              super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
    uVar3 = (pMVar10->dest)._M_string_length;
    if (uVar3 < 7) {
LAB_0019a119:
      psVar11 = (string *)&pMVar10->dest;
    }
    else {
      iVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&pMVar10->dest,uVar3 - 6,6,"cloneE");
      pMVar10 = (puVar14->_M_t).
                super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
                super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
      if (iVar6 != 0) goto LAB_0019a119;
      psVar11 = (string *)&pMVar10->original_dest;
    }
    std::operator<<((ostream *)&outFile,psVar11);
    bVar5 = isBinaryData(&((puVar14->_M_t).
                           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                           .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->data);
    if (bVar5) {
      bVar5 = isEscapableData(&((puVar14->_M_t).
                                super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                                .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->data
                             );
      if (bVar5) {
        poVar7 = std::operator<<((ostream *)&outFile,"\t");
        pMVar10 = (puVar14->_M_t).
                  super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t
                  .super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                  super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
        local_260._M_len = (pMVar10->data).bufferSize;
        local_260._M_str = (char *)(pMVar10->data).heap;
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&local_250,&local_260,&local_291);
        generateJsonQuotedString(&local_280,&local_250);
        poVar7 = std::operator<<(poVar7,(string *)&local_280);
        std::operator<<(poVar7,"\n");
        std::__cxx11::string::~string((string *)&local_280);
        psVar12 = &local_250;
      }
      else {
        poVar7 = std::operator<<((ostream *)&outFile,"\t\"");
        pMVar10 = (puVar14->_M_t).
                  super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t
                  .super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                  super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
        str2encode._M_str = (char *)(pMVar10->data).heap;
        str2encode._M_len = (pMVar10->data).bufferSize;
        encode_abi_cxx11_(&local_280,str2encode);
        poVar7 = std::operator<<(poVar7,(string *)&local_280);
        std::operator<<(poVar7,"\"\n");
        psVar12 = &local_280;
      }
      std::__cxx11::string::~string((string *)psVar12);
    }
    else {
      poVar7 = std::operator<<((ostream *)&outFile,"\t\"");
      pMVar10 = (puVar14->_M_t).
                super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
                super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(char *)(pMVar10->data).heap,(pMVar10->data).bufferSize);
      std::operator<<(poVar7,"\"\n");
    }
    puVar14 = puVar14 + 1;
  } while( true );
}

Assistant:

void Recorder::writeTextFile(const std::string& filename)
{
    std::ofstream outFile(filename.empty() ? outFileName : filename);
    if (!points.empty()) {
        outFile << "#time \ttag\t type*\t value\n";
    }
    for (auto& point : points) {
        if (point.first) {
            outFile << static_cast<double>(point.time) << "\t\t"
                    << subscriptions[point.index].getTarget() << '\t'
                    << subscriptions[point.index].getPublicationType() << '\t'
                    << generateJsonQuotedString(point.value) << '\n';
        } else {
            if (point.iteration > 0) {
                outFile << static_cast<double>(point.time) << ':' << point.iteration << "\t\t"
                        << subscriptions[point.index].getTarget() << '\t'
                        << generateJsonQuotedString(point.value) << '\n';
            } else {
                outFile << static_cast<double>(point.time) << "\t\t"
                        << subscriptions[point.index].getTarget() << '\t'
                        << generateJsonQuotedString(point.value) << '\n';
            }
        }
    }
    if (!messages.empty()) {
        outFile << "# m\t time \tsource\t dest\t message\n";
    }
    for (auto& mess : messages) {
        outFile << "m\t" << static_cast<double>(mess->time) << '\t' << mess->source << '\t';
        if ((mess->dest.size() < 7) ||
            (mess->dest.compare(mess->dest.size() - 6, 6, "cloneE") != 0)) {
            outFile << mess->dest;
        } else {
            outFile << mess->original_dest;
        }
        if (isBinaryData(mess->data)) {
            if (isEscapableData(mess->data)) {
                outFile << "\t" << generateJsonQuotedString(std::string(mess->data.to_string()))
                        << "\n";
            } else {
                outFile << "\t\"" << encode(mess->data.to_string()) << "\"\n";
            }

        } else {
            outFile << "\t\"" << mess->data.to_string() << "\"\n";
        }
    }
}